

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

Status __thiscall CFG::check(CFG *this)

{
  CfgNode *node;
  CfgNode *node_00;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *psVar1;
  CfgEdge *pCVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  Addr AVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  long lVar8;
  unsigned_long_long uVar9;
  _Rb_tree_header *p_Var10;
  
  this->m_complete = true;
  this->m_status = INVALID;
  if ((this->m_entryNode != (CfgNode *)0x0) &&
     (this->m_haltNode != (CfgNode *)0x0 || this->m_exitNode != (CfgNode *)0x0)) {
    uVar9 = 0;
    for (p_Var6 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      node = *(CfgNode **)(p_Var6 + 1);
      switch(node->m_type) {
      case CFG_ENTRY:
        psVar1 = predecessors(this,node);
        if (((psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) ||
           (psVar1 = successors(this,node),
           (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1)) goto LAB_0010815a;
        node_00 = *(CfgNode **)((psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1);
        AVar5 = CfgNode::node2addr(node_00);
        if (AVar5 != this->m_addr) goto LAB_0010815a;
        pCVar2 = findEdge(this,node,node_00);
        if (pCVar2 == (CfgEdge *)0x0) {
          __assert_fail("edge != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,0xa5,"enum CFG::Status CFG::check()");
        }
        if (pCVar2->m_count != this->m_execs) goto LAB_0010815a;
        break;
      case CFG_BLOCK:
        psVar1 = predecessors(this,node);
        if (((psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (psVar1 = successors(this,node),
           (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) goto LAB_0010815a;
        if (node->m_data == (Data *)0x0) {
          __assert_fail("bdata != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,0xb1,"enum CFG::Status CFG::check()");
        }
        if (*(char *)((long)&node->m_data[1]._vptr_Data + 4) == '\x01') {
          this->m_complete = false;
        }
        psVar1 = predecessors(this,node);
        lVar7 = 0;
        for (p_Var3 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var3 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
          pCVar2 = findEdge(this,*(CfgNode **)(p_Var3 + 1),node);
          if (pCVar2 == (CfgEdge *)0x0) {
            __assert_fail("edge != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0xb8,"enum CFG::Status CFG::check()");
          }
          lVar7 = lVar7 + pCVar2->m_count;
        }
        psVar1 = successors(this,node);
        lVar8 = 0;
        for (p_Var3 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var3 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
          pCVar2 = findEdge(this,node,*(CfgNode **)(p_Var3 + 1));
          if (pCVar2 == (CfgEdge *)0x0) {
            __assert_fail("edge != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0xc0,"enum CFG::Status CFG::check()");
          }
          lVar8 = lVar8 + pCVar2->m_count;
        }
        if (lVar7 != lVar8) goto LAB_0010815a;
        break;
      case CFG_PHANTOM:
        psVar1 = predecessors(this,node);
        if (((psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (psVar1 = successors(this,node),
           (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) goto LAB_0010815a;
        if (node->m_data == (Data *)0x0) {
          __assert_fail("node->data() != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,0xce,"enum CFG::Status CFG::check()");
        }
        this->m_complete = false;
        psVar1 = predecessors(this,node);
        p_Var4 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var10 = &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var4 != p_Var10) {
          lVar7 = 0;
          do {
            pCVar2 = findEdge(this,*(CfgNode **)(p_Var4 + 1),node);
            if (pCVar2 == (CfgEdge *)0x0) {
              __assert_fail("edge != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                            ,0xd4,"enum CFG::Status CFG::check()");
            }
            lVar7 = lVar7 + pCVar2->m_count;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          } while ((_Rb_tree_header *)p_Var4 != p_Var10);
          if (lVar7 != 0) goto LAB_0010815a;
        }
        break;
      case CFG_EXIT:
      case CFG_HALT:
        psVar1 = predecessors(this,node);
        if (((psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (psVar1 = successors(this,node),
           (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) goto LAB_0010815a;
        psVar1 = predecessors(this,node);
        for (p_Var3 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var3 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
          pCVar2 = findEdge(this,*(CfgNode **)(p_Var3 + 1),node);
          if (pCVar2 == (CfgEdge *)0x0) {
            __assert_fail("edge != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0xe5,"enum CFG::Status CFG::check()");
          }
          uVar9 = uVar9 + pCVar2->m_count;
        }
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                      ,0xec,"enum CFG::Status CFG::check()");
      }
    }
    if (uVar9 == this->m_execs) {
      this->m_status = VALID;
    }
  }
LAB_0010815a:
  return this->m_status;
}

Assistant:

enum CFG::Status CFG::check() {
	m_complete = true;
	m_status = CFG::INVALID;
	unsigned long long leaving = 0;

	if (!m_entryNode || (!m_exitNode && !m_haltNode))
		goto out;

	for (CfgNode* node : this->nodes()) {
		switch (node->type()) {
			case CfgNode::CFG_ENTRY: {
				if (this->predecessors(node).size() != 0)
					goto out;

				const std::set<CfgNode*>& tmp = this->successors(node);
				if (tmp.size() != 1)
					goto out;

				CfgNode* dst = *(tmp.begin());
				if (CfgNode::node2addr(dst) != this->addr())
					goto out;

				CfgEdge* edge = this->findEdge(node, dst);
				assert(edge != 0);
				if (edge->count() != this->execs())
					goto out;

				} break;
			case CfgNode::CFG_BLOCK: {
				if (this->predecessors(node).size() == 0 ||
					this->successors(node).size() == 0)
					goto out;

				CfgNode::BlockData* bdata =
					static_cast<CfgNode::BlockData*>(node->data());
				assert(bdata != 0);
				if (bdata->indirect())
					m_complete = false;

				unsigned long long preds_count = 0;
				for (CfgNode* src : this->predecessors(node)) {
					CfgEdge* edge = this->findEdge(src, node);
					assert(edge != 0);

					preds_count += edge->count();
				}

				unsigned long long succs_count = 0;
				for (CfgNode* dst : this->successors(node)) {
					CfgEdge* edge = this->findEdge(node, dst);
					assert(edge != 0);

					succs_count += edge->count();
				}

				if (preds_count != succs_count)
					goto out;

				} break;
			case CfgNode::CFG_PHANTOM: {
				if (this->predecessors(node).size() == 0 ||
					this->successors(node).size() != 0)
					goto out;

				assert(node->data() != 0);
				m_complete = false;

				unsigned long long preds_count = 0;
				for (CfgNode* src : this->predecessors(node)) {
					CfgEdge* edge = this->findEdge(src, node);
					assert(edge != 0);

					preds_count += edge->count();
				}

				if (preds_count != 0)
					goto out;

				} break;
			case CfgNode::CFG_EXIT:
			case CfgNode::CFG_HALT:
				if (this->predecessors(node).size() == 0 ||
					this->successors(node).size() != 0)
					goto out;

				for (CfgNode* src : this->predecessors(node)) {
					CfgEdge* edge = this->findEdge(src, node);
					assert(edge != 0);

					leaving += edge->count();
				}

				break;
			default:
				assert(false);
		}
	}

	if (leaving != this->execs())
		goto out;

	m_status = CFG::VALID;

out:
	return m_status;
}